

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall ThreadContext::CompactStoreFieldInlineCaches(ThreadContext *this)

{
  uint uVar1;
  int iVar2;
  Type pSVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar1 = (this->storeFieldInlineCacheByPropId).bucketCount;
  uVar4 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      iVar6 = (this->storeFieldInlineCacheByPropId).buckets[uVar5];
      if (iVar6 != -1) {
        while (iVar6 != -1) {
          pSVar3 = (this->storeFieldInlineCacheByPropId).entries;
          iVar2 = pSVar3[iVar6].
                  super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .
                  super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                  .
                  super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .next;
          CompactInlineCacheList
                    (this,pSVar3[iVar6].
                          super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .
                          super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                          .
                          super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                          .
                          super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                          .value);
          iVar6 = iVar2;
          if (this->unregisteredInlineCacheCount == 0) {
            return;
          }
        }
        uVar4 = (ulong)(this->storeFieldInlineCacheByPropId).bucketCount;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

bool MapEntryUntil(Fn fn) const
        {
            for (uint i = 0; i < bucketCount; i++)
            {
                if(buckets[i] != -1)
                {
                    int nextIndex = -1;
                    for (int currentIndex = buckets[i] ; currentIndex != -1 ; currentIndex = nextIndex)
                    {
                        nextIndex = entries[currentIndex].next;
                        if (fn(entries[currentIndex]))
                        {
                            return true; // fn condition succeeds
                        }
                    }
                }
            }

            return false;
        }